

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_node(lys_module *module,lys_node *parent,lys_node **root,char *value,int nodetype,
                     int sizeof_struct)

{
  LY_ERR *pLVar1;
  char *pcVar2;
  ly_ctx *plVar3;
  lys_node **local_50;
  lys_node **child;
  lys_node *node;
  int sizeof_struct_local;
  int nodetype_local;
  char *value_local;
  lys_node **root_local;
  lys_node *parent_local;
  lys_module *module_local;
  
  module_local = (lys_module *)calloc(1,(long)sizeof_struct);
  if (module_local == (lys_module *)0x0) {
    free(value);
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_node");
    module_local = (lys_module *)0x0;
  }
  else {
    if ('\x02' < ly_log_level) {
      pcVar2 = strnodetype(nodetype);
      ly_log_dbg(LY_LDGYANG,"parsing %s statement \"%s\"",pcVar2,value);
    }
    plVar3 = (ly_ctx *)lydict_insert_zc(module->ctx,value);
    module_local->ctx = plVar3;
    module_local->contact = (char *)module;
    *(int *)&module_local->filepath = nodetype;
    local_50 = root;
    if (parent != (lys_node *)0x0) {
      local_50 = &parent->child;
    }
    if (*local_50 == (lys_node *)0x0) {
      *local_50 = (lys_node *)module_local;
      module_local->imp = (lys_import *)module_local;
    }
    else {
      (*local_50)->prev->next = (lys_node *)module_local;
      (*local_50)->prev = (lys_node *)module_local;
    }
  }
  return module_local;
}

Assistant:

void *
yang_read_node(struct lys_module *module, struct lys_node *parent, struct lys_node **root,
               char *value, int nodetype, int sizeof_struct)
{
    struct lys_node *node, **child;

    node = calloc(1, sizeof_struct);
    if (!node) {
        free(value);
        LOGMEM;
        return NULL;
    }
    LOGDBG(LY_LDGYANG, "parsing %s statement \"%s\"", strnodetype(nodetype), value);
    node->name = lydict_insert_zc(module->ctx, value);
    node->module = module;
    node->nodetype = nodetype;

    /* insert the node into the schema tree */
    child = (parent) ? &parent->child : root;
    if (*child) {
        (*child)->prev->next = node;
        (*child)->prev = node;
    } else {
        *child = node;
        node->prev = node;
    }
    return node;
}